

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O3

void __thiscall Js::PolymorphicInlineCache::Dump(PolymorphicInlineCache *this)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  uVar1 = (ulong)this->size;
  if (this->size != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      if (*(long *)((long)&this->inlineCaches->u + lVar3) != 0) {
        Output::Print(L"  %d: ",uVar2 & 0xffffffff);
        InlineCache::Dump((InlineCache *)((long)&this->inlineCaches->u + lVar3));
        Output::Print(L"\n");
        uVar1 = (ulong)this->size;
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar2 < uVar1);
  }
  return;
}

Assistant:

void PolymorphicInlineCache::Dump()
    {
        for (uint i = 0; i < size; ++i)
        {
            if (!inlineCaches[i].IsEmpty())
            {
                Output::Print(_u("  %d: "), i);
                inlineCaches[i].Dump();
                Output::Print(_u("\n"));
            }
        }
    }